

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtable_test.cpp
# Opt level: O3

int main(void)

{
  _func_void *p_Var1;
  _func_void *p_Var2;
  code *pcVar3;
  ostream *poVar4;
  void *pvVar5;
  undefined8 uVar6;
  undefined8 *puVar7;
  printable_vtable *printable;
  printable_vtable *ppVar8;
  printable_vtable *ppVar9;
  vector<printable_vtable,_std::allocator<printable_vtable>_> *__range1;
  long lVar10;
  initializer_list<printable_vtable> __l;
  initializer_list<copy_on_write<printable_vtable>_> __l_00;
  printable_vtable ap_1;
  printable_vtable ap_7;
  printable_vtable ap;
  printable_vtable pStack_121f8;
  printable_vtable pStack_121c8;
  printable_vtable pStack_12198;
  printable_vtable pStack_12168;
  _func_void *p_Stack_12140;
  printable_vtable pStack_12138;
  printable_vtable apStack_12110 [204];
  vector<double,_std::allocator<double>_> avStack_10118 [342];
  vector<double,_std::allocator<double>_> local_e0f8 [342];
  vector<double,_std::allocator<double>_> local_c0d8 [342];
  vector<double,_std::allocator<double>_> local_a0b8 [342];
  vector<double,_std::allocator<double>_> local_8098 [342];
  vector<double,_std::allocator<double>_> local_6078 [342];
  large_printable local_4060;
  large_printable local_2048;
  
  allocations()::allocations_ = 0;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"sizeof(printable_vtable) = ",0x1b);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"hi_printable hi; printable_vtable ap(hi)",0x28);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,";\nap.print() = ",0xf);
  pStack_12138.vtable_._M_elems[2] = printable_vtable::print_wrapper<hi_printable>::exec;
  pStack_12138.vtable_._M_elems[0] = printable_vtable::clone_impl<hi_printable>;
  pStack_12138.vtable_._M_elems[1] = printable_vtable::delete_impl<hi_printable>;
  pStack_12138.get_value_ptr_ = printable_vtable::get_value_ptr<false>;
  pStack_12138.value_ = (void *)0x0;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Hello, world!\n",0xe);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"allocations: ",0xd);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n\n",2);
  p_Var1 = pStack_12138.vtable_._M_elems[1];
  allocations()::allocations_ = 0;
  if (pStack_12138.get_value_ptr_ == printable_vtable::get_value_ptr<true>) {
    pvVar5 = printable_vtable::get_value_ptr<true>(&pStack_12138);
    (*p_Var1)(pvVar5);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"large_printable large; printable_vtable ap(large)",0x31);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,";\nap.print() = ",0xf);
  allocations()::allocations_ = allocations()::allocations_ + 1;
  pStack_12138.vtable_._M_elems[0] = (_func_void *)calloc(1,0x800000);
  pStack_12138.vtable_._M_elems[1] = pStack_12138.vtable_._M_elems[0] + 0x800000;
  pStack_12138.vtable_._M_elems[2] = pStack_12138.vtable_._M_elems[1];
  std::vector<double,_std::allocator<double>_>::vector
            (local_6078,(vector<double,_std::allocator<double>_> *)&pStack_12138);
  pStack_121f8.vtable_._M_elems[2] = printable_vtable::print_wrapper<large_printable>::exec;
  pStack_121f8.vtable_._M_elems[0] = printable_vtable::clone_impl<large_printable>;
  pStack_121f8.vtable_._M_elems[1] = printable_vtable::delete_impl<large_printable>;
  pStack_121f8.get_value_ptr_ = printable_vtable::get_value_ptr<true>;
  allocations()::allocations_ = allocations()::allocations_ + 1;
  pStack_121f8.value_ = malloc(0x2018);
  *(pointer *)pStack_121f8.value_ =
       local_6078[0].super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_start;
  *(pointer *)((long)pStack_121f8.value_ + 8) =
       local_6078[0].super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_finish;
  *(pointer *)((long)pStack_121f8.value_ + 0x10) =
       local_6078[0].super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_6078[0].super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_6078[0].super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_6078[0].super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"I\'m expensive to copy.\n",0x17);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"allocations: ",0xd);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n\n",2);
  p_Var1 = pStack_121f8.vtable_._M_elems[1];
  allocations()::allocations_ = 0;
  if (pStack_121f8.get_value_ptr_ == printable_vtable::get_value_ptr<true>) {
    pvVar5 = printable_vtable::get_value_ptr<true>(&pStack_121f8);
    (*p_Var1)(pvVar5);
  }
  if (pStack_12138.vtable_._M_elems[0] != (_func_void *)0x0) {
    free(pStack_12138.vtable_._M_elems[0]);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"bye_printable bye; printable_vtable ap(bye)",0x2b);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,";\nap.print() = ",0xf);
  pStack_12138.vtable_._M_elems[2] = printable_vtable::print_wrapper<bye_printable>::exec;
  pStack_12138.vtable_._M_elems[0] = printable_vtable::clone_impl<bye_printable>;
  pStack_12138.vtable_._M_elems[1] = printable_vtable::delete_impl<bye_printable>;
  pStack_12138.get_value_ptr_ = printable_vtable::get_value_ptr<false>;
  pStack_12138.value_ = (void *)0x0;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Bye, now!\n",10);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"allocations: ",0xd);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n\n",2);
  p_Var1 = pStack_12138.vtable_._M_elems[1];
  allocations()::allocations_ = 0;
  if (pStack_12138.get_value_ptr_ == printable_vtable::get_value_ptr<true>) {
    pvVar5 = printable_vtable::get_value_ptr<true>(&pStack_12138);
    (*p_Var1)(pvVar5);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"hi_printable hi; printable_vtable ap = hi",0x29);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,";\nap.print() = ",0xf);
  pStack_12138.vtable_._M_elems[2] = printable_vtable::print_wrapper<hi_printable>::exec;
  pStack_12138.vtable_._M_elems[0] = printable_vtable::clone_impl<hi_printable>;
  pStack_12138.vtable_._M_elems[1] = printable_vtable::delete_impl<hi_printable>;
  pStack_12138.get_value_ptr_ = printable_vtable::get_value_ptr<false>;
  pStack_12138.value_ = (void *)0x0;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Hello, world!\n",0xe);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"allocations: ",0xd);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n\n",2);
  p_Var1 = pStack_12138.vtable_._M_elems[1];
  allocations()::allocations_ = 0;
  if (pStack_12138.get_value_ptr_ == printable_vtable::get_value_ptr<true>) {
    pvVar5 = printable_vtable::get_value_ptr<true>(&pStack_12138);
    (*p_Var1)(pvVar5);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"large_printable large; printable_vtable ap = large",0x32);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,";\nap.print() = ",0xf);
  allocations()::allocations_ = allocations()::allocations_ + 1;
  pStack_12138.vtable_._M_elems[0] = (_func_void *)calloc(1,0x800000);
  pStack_12138.vtable_._M_elems[1] = pStack_12138.vtable_._M_elems[0] + 0x800000;
  pStack_12138.vtable_._M_elems[2] = pStack_12138.vtable_._M_elems[1];
  std::vector<double,_std::allocator<double>_>::vector
            (local_8098,(vector<double,_std::allocator<double>_> *)&pStack_12138);
  pStack_121f8.vtable_._M_elems[2] = printable_vtable::print_wrapper<large_printable>::exec;
  pStack_121f8.vtable_._M_elems[0] = printable_vtable::clone_impl<large_printable>;
  pStack_121f8.vtable_._M_elems[1] = printable_vtable::delete_impl<large_printable>;
  pStack_121f8.get_value_ptr_ = printable_vtable::get_value_ptr<true>;
  allocations()::allocations_ = allocations()::allocations_ + 1;
  pStack_121f8.value_ = malloc(0x2018);
  *(pointer *)pStack_121f8.value_ =
       local_8098[0].super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_start;
  *(pointer *)((long)pStack_121f8.value_ + 8) =
       local_8098[0].super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_finish;
  *(pointer *)((long)pStack_121f8.value_ + 0x10) =
       local_8098[0].super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_8098[0].super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_8098[0].super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_8098[0].super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"I\'m expensive to copy.\n",0x17);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"allocations: ",0xd);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n\n",2);
  p_Var1 = pStack_121f8.vtable_._M_elems[1];
  allocations()::allocations_ = 0;
  if (pStack_121f8.get_value_ptr_ == printable_vtable::get_value_ptr<true>) {
    pvVar5 = printable_vtable::get_value_ptr<true>(&pStack_121f8);
    (*p_Var1)(pvVar5);
  }
  if (pStack_12138.vtable_._M_elems[0] != (_func_void *)0x0) {
    free(pStack_12138.vtable_._M_elems[0]);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"bye_printable bye; printable_vtable ap = bye",0x2c);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,";\nap.print() = ",0xf);
  pStack_12138.vtable_._M_elems[2] = printable_vtable::print_wrapper<bye_printable>::exec;
  pStack_12138.vtable_._M_elems[0] = printable_vtable::clone_impl<bye_printable>;
  pStack_12138.vtable_._M_elems[1] = printable_vtable::delete_impl<bye_printable>;
  pStack_12138.get_value_ptr_ = printable_vtable::get_value_ptr<false>;
  pStack_12138.value_ = (void *)0x0;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Bye, now!\n",10);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"allocations: ",0xd);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n\n",2);
  p_Var1 = pStack_12138.vtable_._M_elems[1];
  allocations()::allocations_ = 0;
  if (pStack_12138.get_value_ptr_ == printable_vtable::get_value_ptr<true>) {
    pvVar5 = printable_vtable::get_value_ptr<true>(&pStack_12138);
    (*p_Var1)(pvVar5);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "hi_printable hi; printable_vtable tmp = hi; printable_vtable ap = tmp",0x45);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,";\nap.print() = ",0xf);
  pStack_12138.vtable_._M_elems[2] = printable_vtable::print_wrapper<hi_printable>::exec;
  pStack_12138.vtable_._M_elems[0] = printable_vtable::clone_impl<hi_printable>;
  pStack_12138.vtable_._M_elems[1] = printable_vtable::delete_impl<hi_printable>;
  pStack_12138.get_value_ptr_ = printable_vtable::get_value_ptr<false>;
  pStack_12138.value_ = (void *)0x0;
  pStack_121f8.vtable_._M_elems[2] = printable_vtable::print_wrapper<hi_printable>::exec;
  pStack_121f8.vtable_._M_elems[0] = printable_vtable::clone_impl<hi_printable>;
  pStack_121f8.vtable_._M_elems[1] = printable_vtable::delete_impl<hi_printable>;
  pStack_121f8.get_value_ptr_ = printable_vtable::get_value_ptr<false>;
  pStack_121f8.value_ = (void *)0x0;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Hello, world!\n",0xe);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"allocations: ",0xd);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n\n",2);
  p_Var1 = pStack_121f8.vtable_._M_elems[1];
  allocations()::allocations_ = 0;
  if (pStack_121f8.get_value_ptr_ == printable_vtable::get_value_ptr<true>) {
    pvVar5 = printable_vtable::get_value_ptr<true>(&pStack_121f8);
    (*p_Var1)(pvVar5);
  }
  p_Var1 = pStack_12138.vtable_._M_elems[1];
  if (pStack_12138.get_value_ptr_ == printable_vtable::get_value_ptr<true>) {
    pvVar5 = printable_vtable::get_value_ptr<true>(&pStack_12138);
    (*p_Var1)(pvVar5);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "large_printable large; printable_vtable tmp = large; printable_vtable ap = tmp",0x4e);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,";\nap.print() = ",0xf);
  allocations()::allocations_ = allocations()::allocations_ + 1;
  pStack_12138.vtable_._M_elems[0] = (_func_void *)calloc(1,0x800000);
  pStack_12138.vtable_._M_elems[1] = pStack_12138.vtable_._M_elems[0] + 0x800000;
  pStack_12138.vtable_._M_elems[2] = pStack_12138.vtable_._M_elems[1];
  std::vector<double,_std::allocator<double>_>::vector
            (local_a0b8,(vector<double,_std::allocator<double>_> *)&pStack_12138);
  pStack_121f8.vtable_._M_elems[2] = printable_vtable::print_wrapper<large_printable>::exec;
  pStack_121f8.vtable_._M_elems[0] = printable_vtable::clone_impl<large_printable>;
  pStack_121f8.vtable_._M_elems[1] = printable_vtable::delete_impl<large_printable>;
  pStack_121f8.get_value_ptr_ = printable_vtable::get_value_ptr<true>;
  allocations()::allocations_ = allocations()::allocations_ + 1;
  pStack_121f8.value_ = malloc(0x2018);
  *(pointer *)pStack_121f8.value_ =
       local_a0b8[0].super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_start;
  *(pointer *)((long)pStack_121f8.value_ + 8) =
       local_a0b8[0].super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_finish;
  *(pointer *)((long)pStack_121f8.value_ + 0x10) =
       local_a0b8[0].super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_a0b8[0].super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_a0b8[0].super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_a0b8[0].super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  pStack_121c8.vtable_._M_elems[2] = printable_vtable::print_wrapper<large_printable>::exec;
  pStack_121c8.vtable_._M_elems[0] = printable_vtable::clone_impl<large_printable>;
  pStack_121c8.vtable_._M_elems[1] = printable_vtable::delete_impl<large_printable>;
  pStack_121c8.get_value_ptr_ = printable_vtable::get_value_ptr<true>;
  pStack_121c8.value_ = printable_vtable::clone_impl<large_printable>(pStack_121f8.value_);
  p_Var1 = pStack_121c8.vtable_._M_elems[2];
  uVar6 = (*pStack_121c8.get_value_ptr_)();
  (*p_Var1)(uVar6);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"allocations: ",0xd);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n\n",2);
  p_Var1 = pStack_121c8.vtable_._M_elems[1];
  allocations()::allocations_ = 0;
  if (pStack_121c8.get_value_ptr_ == printable_vtable::get_value_ptr<true>) {
    pvVar5 = printable_vtable::get_value_ptr<true>(&pStack_121c8);
    (*p_Var1)(pvVar5);
  }
  p_Var1 = pStack_121f8.vtable_._M_elems[1];
  if (pStack_121f8.get_value_ptr_ == printable_vtable::get_value_ptr<true>) {
    pvVar5 = printable_vtable::get_value_ptr<true>(&pStack_121f8);
    (*p_Var1)(pvVar5);
  }
  if (pStack_12138.vtable_._M_elems[0] != (_func_void *)0x0) {
    free(pStack_12138.vtable_._M_elems[0]);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "bye_printable bye; printable_vtable tmp = bye; printable_vtable ap = tmp",0x48);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,";\nap.print() = ",0xf);
  pStack_12138.vtable_._M_elems[2] = printable_vtable::print_wrapper<bye_printable>::exec;
  pStack_12138.vtable_._M_elems[0] = printable_vtable::clone_impl<bye_printable>;
  pStack_12138.vtable_._M_elems[1] = printable_vtable::delete_impl<bye_printable>;
  pStack_12138.get_value_ptr_ = printable_vtable::get_value_ptr<false>;
  pStack_12138.value_ = (void *)0x0;
  pStack_121f8.vtable_._M_elems[2] = printable_vtable::print_wrapper<bye_printable>::exec;
  pStack_121f8.vtable_._M_elems[0] = printable_vtable::clone_impl<bye_printable>;
  pStack_121f8.vtable_._M_elems[1] = printable_vtable::delete_impl<bye_printable>;
  pStack_121f8.get_value_ptr_ = printable_vtable::get_value_ptr<false>;
  pStack_121f8.value_ = (void *)0x0;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Bye, now!\n",10);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"allocations: ",0xd);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n\n",2);
  p_Var1 = pStack_121f8.vtable_._M_elems[1];
  allocations()::allocations_ = 0;
  if (pStack_121f8.get_value_ptr_ == printable_vtable::get_value_ptr<true>) {
    pvVar5 = printable_vtable::get_value_ptr<true>(&pStack_121f8);
    (*p_Var1)(pvVar5);
  }
  p_Var1 = pStack_12138.vtable_._M_elems[1];
  if (pStack_12138.get_value_ptr_ == printable_vtable::get_value_ptr<true>) {
    pvVar5 = printable_vtable::get_value_ptr<true>(&pStack_12138);
    (*p_Var1)(pvVar5);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"hi_printable hi; printable_vtable ap; ap = hi",0x2d);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,";\nap.print() = ",0xf);
  pStack_12138.get_value_ptr_ = printable_vtable::get_value_ptr<false>;
  pStack_12138.value_ = (void *)0x0;
  printable_vtable::operator=();
  p_Var1 = pStack_12138.vtable_._M_elems[2];
  pvVar5 = (*pStack_12138.get_value_ptr_)(&pStack_12138);
  (*p_Var1)(pvVar5);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"allocations: ",0xd);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n\n",2);
  p_Var1 = pStack_12138.vtable_._M_elems[1];
  allocations()::allocations_ = 0;
  if (pStack_12138.get_value_ptr_ == printable_vtable::get_value_ptr<true>) {
    pvVar5 = printable_vtable::get_value_ptr<true>(&pStack_12138);
    (*p_Var1)(pvVar5);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"large_printable large; printable_vtable ap; ap = large",0x36);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,";\nap.print() = ",0xf);
  allocations()::allocations_ = allocations()::allocations_ + 1;
  pStack_12138.vtable_._M_elems[0] = (_func_void *)calloc(1,0x800000);
  pStack_12138.vtable_._M_elems[1] = pStack_12138.vtable_._M_elems[0] + 0x800000;
  pStack_121f8.get_value_ptr_ = printable_vtable::get_value_ptr<false>;
  pStack_121f8.value_ = (void *)0x0;
  pStack_12138.vtable_._M_elems[2] = pStack_12138.vtable_._M_elems[1];
  std::vector<double,_std::allocator<double>_>::vector
            (&local_2048.data_,(vector<double,_std::allocator<double>_> *)&pStack_12138);
  printable_vtable::operator=(&pStack_121f8,&local_2048);
  if (local_2048.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    free(local_2048.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_start);
  }
  p_Var1 = pStack_121f8.vtable_._M_elems[2];
  pvVar5 = (*pStack_121f8.get_value_ptr_)(&pStack_121f8);
  (*p_Var1)(pvVar5);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"allocations: ",0xd);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n\n",2);
  p_Var1 = pStack_121f8.vtable_._M_elems[1];
  allocations()::allocations_ = 0;
  if (pStack_121f8.get_value_ptr_ == printable_vtable::get_value_ptr<true>) {
    pvVar5 = printable_vtable::get_value_ptr<true>(&pStack_121f8);
    (*p_Var1)(pvVar5);
  }
  if (pStack_12138.vtable_._M_elems[0] != (_func_void *)0x0) {
    free(pStack_12138.vtable_._M_elems[0]);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"bye_printable bye; printable_vtable ap; ap = bye",0x30);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,";\nap.print() = ",0xf);
  pStack_12138.get_value_ptr_ = printable_vtable::get_value_ptr<false>;
  pStack_12138.value_ = (void *)0x0;
  printable_vtable::operator=();
  p_Var1 = pStack_12138.vtable_._M_elems[2];
  pvVar5 = (*pStack_12138.get_value_ptr_)(&pStack_12138);
  (*p_Var1)(pvVar5);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"allocations: ",0xd);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n\n",2);
  p_Var1 = pStack_12138.vtable_._M_elems[1];
  allocations()::allocations_ = 0;
  if (pStack_12138.get_value_ptr_ == printable_vtable::get_value_ptr<true>) {
    pvVar5 = printable_vtable::get_value_ptr<true>(&pStack_12138);
    (*p_Var1)(pvVar5);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"const hi_printable hi{}; printable_vtable ap(hi)",0x30);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,";\nap.print() = ",0xf);
  pStack_12138.vtable_._M_elems[2] = printable_vtable::print_wrapper<hi_printable>::exec;
  pStack_12138.vtable_._M_elems[0] = printable_vtable::clone_impl<hi_printable>;
  pStack_12138.vtable_._M_elems[1] = printable_vtable::delete_impl<hi_printable>;
  pStack_12138.get_value_ptr_ = printable_vtable::get_value_ptr<false>;
  pStack_12138.value_ = (void *)0x0;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Hello, world!\n",0xe);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"allocations: ",0xd);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n\n",2);
  p_Var1 = pStack_12138.vtable_._M_elems[1];
  allocations()::allocations_ = 0;
  if (pStack_12138.get_value_ptr_ == printable_vtable::get_value_ptr<true>) {
    pvVar5 = printable_vtable::get_value_ptr<true>(&pStack_12138);
    (*p_Var1)(pvVar5);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"const large_printable large{}; printable_vtable ap(large)",0x39)
  ;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,";\nap.print() = ",0xf);
  allocations()::allocations_ = allocations()::allocations_ + 1;
  pStack_12138.vtable_._M_elems[0] = (_func_void *)calloc(1,0x800000);
  pStack_12138.vtable_._M_elems[1] = pStack_12138.vtable_._M_elems[0] + 0x800000;
  pStack_12138.vtable_._M_elems[2] = pStack_12138.vtable_._M_elems[1];
  std::vector<double,_std::allocator<double>_>::vector
            (local_c0d8,(vector<double,_std::allocator<double>_> *)&pStack_12138);
  pStack_121f8.vtable_._M_elems[2] = printable_vtable::print_wrapper<large_printable>::exec;
  pStack_121f8.vtable_._M_elems[0] = printable_vtable::clone_impl<large_printable>;
  pStack_121f8.vtable_._M_elems[1] = printable_vtable::delete_impl<large_printable>;
  pStack_121f8.get_value_ptr_ = printable_vtable::get_value_ptr<true>;
  allocations()::allocations_ = allocations()::allocations_ + 1;
  pStack_121f8.value_ = malloc(0x2018);
  *(pointer *)pStack_121f8.value_ =
       local_c0d8[0].super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_start;
  *(pointer *)((long)pStack_121f8.value_ + 8) =
       local_c0d8[0].super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_finish;
  *(pointer *)((long)pStack_121f8.value_ + 0x10) =
       local_c0d8[0].super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_c0d8[0].super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_c0d8[0].super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_c0d8[0].super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"I\'m expensive to copy.\n",0x17);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"allocations: ",0xd);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n\n",2);
  p_Var1 = pStack_121f8.vtable_._M_elems[1];
  allocations()::allocations_ = 0;
  if (pStack_121f8.get_value_ptr_ == printable_vtable::get_value_ptr<true>) {
    pvVar5 = printable_vtable::get_value_ptr<true>(&pStack_121f8);
    (*p_Var1)(pvVar5);
  }
  if (pStack_12138.vtable_._M_elems[0] != (_func_void *)0x0) {
    free(pStack_12138.vtable_._M_elems[0]);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"const bye_printable bye{}; printable_vtable ap(bye)",0x33);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,";\nap.print() = ",0xf);
  pStack_12138.vtable_._M_elems[2] = printable_vtable::print_wrapper<bye_printable>::exec;
  pStack_12138.vtable_._M_elems[0] = printable_vtable::clone_impl<bye_printable>;
  pStack_12138.vtable_._M_elems[1] = printable_vtable::delete_impl<bye_printable>;
  pStack_12138.get_value_ptr_ = printable_vtable::get_value_ptr<false>;
  pStack_12138.value_ = (void *)0x0;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Bye, now!\n",10);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"allocations: ",0xd);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n\n",2);
  p_Var1 = pStack_12138.vtable_._M_elems[1];
  allocations()::allocations_ = 0;
  if (pStack_12138.get_value_ptr_ == printable_vtable::get_value_ptr<true>) {
    pvVar5 = printable_vtable::get_value_ptr<true>(&pStack_12138);
    (*p_Var1)(pvVar5);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"const hi_printable hi{}; printable_vtable ap = hi",0x31);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,";\nap.print() = ",0xf);
  pStack_12138.vtable_._M_elems[2] = printable_vtable::print_wrapper<hi_printable>::exec;
  pStack_12138.vtable_._M_elems[0] = printable_vtable::clone_impl<hi_printable>;
  pStack_12138.vtable_._M_elems[1] = printable_vtable::delete_impl<hi_printable>;
  pStack_12138.get_value_ptr_ = printable_vtable::get_value_ptr<false>;
  pStack_12138.value_ = (void *)0x0;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Hello, world!\n",0xe);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"allocations: ",0xd);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n\n",2);
  p_Var1 = pStack_12138.vtable_._M_elems[1];
  allocations()::allocations_ = 0;
  if (pStack_12138.get_value_ptr_ == printable_vtable::get_value_ptr<true>) {
    pvVar5 = printable_vtable::get_value_ptr<true>(&pStack_12138);
    (*p_Var1)(pvVar5);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"const large_printable large{}; printable_vtable ap = large",0x3a
            );
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,";\nap.print() = ",0xf);
  allocations()::allocations_ = allocations()::allocations_ + 1;
  pStack_12138.vtable_._M_elems[0] = (_func_void *)calloc(1,0x800000);
  pStack_12138.vtable_._M_elems[1] = pStack_12138.vtable_._M_elems[0] + 0x800000;
  pStack_12138.vtable_._M_elems[2] = pStack_12138.vtable_._M_elems[1];
  std::vector<double,_std::allocator<double>_>::vector
            (local_e0f8,(vector<double,_std::allocator<double>_> *)&pStack_12138);
  pStack_121f8.vtable_._M_elems[2] = printable_vtable::print_wrapper<large_printable>::exec;
  pStack_121f8.vtable_._M_elems[0] = printable_vtable::clone_impl<large_printable>;
  pStack_121f8.vtable_._M_elems[1] = printable_vtable::delete_impl<large_printable>;
  pStack_121f8.get_value_ptr_ = printable_vtable::get_value_ptr<true>;
  allocations()::allocations_ = allocations()::allocations_ + 1;
  pStack_121f8.value_ = malloc(0x2018);
  *(pointer *)pStack_121f8.value_ =
       local_e0f8[0].super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_start;
  *(pointer *)((long)pStack_121f8.value_ + 8) =
       local_e0f8[0].super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_finish;
  *(pointer *)((long)pStack_121f8.value_ + 0x10) =
       local_e0f8[0].super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_e0f8[0].super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_e0f8[0].super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_e0f8[0].super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"I\'m expensive to copy.\n",0x17);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"allocations: ",0xd);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n\n",2);
  p_Var1 = pStack_121f8.vtable_._M_elems[1];
  allocations()::allocations_ = 0;
  if (pStack_121f8.get_value_ptr_ == printable_vtable::get_value_ptr<true>) {
    pvVar5 = printable_vtable::get_value_ptr<true>(&pStack_121f8);
    (*p_Var1)(pvVar5);
  }
  if (pStack_12138.vtable_._M_elems[0] != (_func_void *)0x0) {
    free(pStack_12138.vtable_._M_elems[0]);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"const bye_printable bye{}; printable_vtable ap = bye",0x34);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,";\nap.print() = ",0xf);
  pStack_12138.vtable_._M_elems[2] = printable_vtable::print_wrapper<bye_printable>::exec;
  pStack_12138.vtable_._M_elems[0] = printable_vtable::clone_impl<bye_printable>;
  pStack_12138.vtable_._M_elems[1] = printable_vtable::delete_impl<bye_printable>;
  pStack_12138.get_value_ptr_ = printable_vtable::get_value_ptr<false>;
  pStack_12138.value_ = (void *)0x0;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Bye, now!\n",10);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"allocations: ",0xd);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n\n",2);
  p_Var1 = pStack_12138.vtable_._M_elems[1];
  allocations()::allocations_ = 0;
  if (pStack_12138.get_value_ptr_ == printable_vtable::get_value_ptr<true>) {
    pvVar5 = printable_vtable::get_value_ptr<true>(&pStack_12138);
    (*p_Var1)(pvVar5);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "const hi_printable hi{}; printable_vtable tmp = hi; printable_vtable ap = tmp",0x4d);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,";\nap.print() = ",0xf);
  pStack_12138.vtable_._M_elems[2] = printable_vtable::print_wrapper<hi_printable>::exec;
  pStack_12138.vtable_._M_elems[0] = printable_vtable::clone_impl<hi_printable>;
  pStack_12138.vtable_._M_elems[1] = printable_vtable::delete_impl<hi_printable>;
  pStack_12138.get_value_ptr_ = printable_vtable::get_value_ptr<false>;
  pStack_12138.value_ = (void *)0x0;
  pStack_121f8.vtable_._M_elems[2] = printable_vtable::print_wrapper<hi_printable>::exec;
  pStack_121f8.vtable_._M_elems[0] = printable_vtable::clone_impl<hi_printable>;
  pStack_121f8.vtable_._M_elems[1] = printable_vtable::delete_impl<hi_printable>;
  pStack_121f8.get_value_ptr_ = printable_vtable::get_value_ptr<false>;
  pStack_121f8.value_ = (void *)0x0;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Hello, world!\n",0xe);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"allocations: ",0xd);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n\n",2);
  p_Var1 = pStack_121f8.vtable_._M_elems[1];
  allocations()::allocations_ = 0;
  if (pStack_121f8.get_value_ptr_ == printable_vtable::get_value_ptr<true>) {
    pvVar5 = printable_vtable::get_value_ptr<true>(&pStack_121f8);
    (*p_Var1)(pvVar5);
  }
  p_Var1 = pStack_12138.vtable_._M_elems[1];
  if (pStack_12138.get_value_ptr_ == printable_vtable::get_value_ptr<true>) {
    pvVar5 = printable_vtable::get_value_ptr<true>(&pStack_12138);
    (*p_Var1)(pvVar5);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "const large_printable large{}; printable_vtable tmp = large; printable_vtable ap = tmp"
             ,0x56);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,";\nap.print() = ",0xf);
  allocations()::allocations_ = allocations()::allocations_ + 1;
  pStack_12138.vtable_._M_elems[0] = (_func_void *)calloc(1,0x800000);
  pStack_12138.vtable_._M_elems[1] = pStack_12138.vtable_._M_elems[0] + 0x800000;
  pStack_12138.vtable_._M_elems[2] = pStack_12138.vtable_._M_elems[1];
  std::vector<double,_std::allocator<double>_>::vector
            (avStack_10118,(vector<double,_std::allocator<double>_> *)&pStack_12138);
  pStack_121f8.vtable_._M_elems[2] = printable_vtable::print_wrapper<large_printable>::exec;
  pStack_121f8.vtable_._M_elems[0] = printable_vtable::clone_impl<large_printable>;
  pStack_121f8.vtable_._M_elems[1] = printable_vtable::delete_impl<large_printable>;
  pStack_121f8.get_value_ptr_ = printable_vtable::get_value_ptr<true>;
  allocations()::allocations_ = allocations()::allocations_ + 1;
  pStack_121f8.value_ = malloc(0x2018);
  *(pointer *)pStack_121f8.value_ =
       avStack_10118[0].super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_start;
  *(pointer *)((long)pStack_121f8.value_ + 8) =
       avStack_10118[0].super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_finish;
  *(pointer *)((long)pStack_121f8.value_ + 0x10) =
       avStack_10118[0].super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  avStack_10118[0].super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  avStack_10118[0].super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  avStack_10118[0].super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pStack_121c8.vtable_._M_elems[2] = printable_vtable::print_wrapper<large_printable>::exec;
  pStack_121c8.vtable_._M_elems[0] = printable_vtable::clone_impl<large_printable>;
  pStack_121c8.vtable_._M_elems[1] = printable_vtable::delete_impl<large_printable>;
  pStack_121c8.get_value_ptr_ = printable_vtable::get_value_ptr<true>;
  pStack_121c8.value_ = printable_vtable::clone_impl<large_printable>(pStack_121f8.value_);
  p_Var1 = pStack_121c8.vtable_._M_elems[2];
  uVar6 = (*pStack_121c8.get_value_ptr_)();
  (*p_Var1)(uVar6);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"allocations: ",0xd);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n\n",2);
  p_Var1 = pStack_121c8.vtable_._M_elems[1];
  allocations()::allocations_ = 0;
  if (pStack_121c8.get_value_ptr_ == printable_vtable::get_value_ptr<true>) {
    pvVar5 = printable_vtable::get_value_ptr<true>(&pStack_121c8);
    (*p_Var1)(pvVar5);
  }
  p_Var1 = pStack_121f8.vtable_._M_elems[1];
  if (pStack_121f8.get_value_ptr_ == printable_vtable::get_value_ptr<true>) {
    pvVar5 = printable_vtable::get_value_ptr<true>(&pStack_121f8);
    (*p_Var1)(pvVar5);
  }
  if (pStack_12138.vtable_._M_elems[0] != (_func_void *)0x0) {
    free(pStack_12138.vtable_._M_elems[0]);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "const bye_printable bye{}; printable_vtable tmp = bye; printable_vtable ap = tmp",0x50
            );
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,";\nap.print() = ",0xf);
  pStack_12138.vtable_._M_elems[2] = printable_vtable::print_wrapper<bye_printable>::exec;
  pStack_12138.vtable_._M_elems[0] = printable_vtable::clone_impl<bye_printable>;
  pStack_12138.vtable_._M_elems[1] = printable_vtable::delete_impl<bye_printable>;
  pStack_12138.get_value_ptr_ = printable_vtable::get_value_ptr<false>;
  pStack_12138.value_ = (void *)0x0;
  pStack_121f8.vtable_._M_elems[2] = printable_vtable::print_wrapper<bye_printable>::exec;
  pStack_121f8.vtable_._M_elems[0] = printable_vtable::clone_impl<bye_printable>;
  pStack_121f8.vtable_._M_elems[1] = printable_vtable::delete_impl<bye_printable>;
  pStack_121f8.get_value_ptr_ = printable_vtable::get_value_ptr<false>;
  pStack_121f8.value_ = (void *)0x0;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Bye, now!\n",10);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"allocations: ",0xd);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n\n",2);
  p_Var1 = pStack_121f8.vtable_._M_elems[1];
  allocations()::allocations_ = 0;
  if (pStack_121f8.get_value_ptr_ == printable_vtable::get_value_ptr<true>) {
    pvVar5 = printable_vtable::get_value_ptr<true>(&pStack_121f8);
    (*p_Var1)(pvVar5);
  }
  p_Var1 = pStack_12138.vtable_._M_elems[1];
  if (pStack_12138.get_value_ptr_ == printable_vtable::get_value_ptr<true>) {
    pvVar5 = printable_vtable::get_value_ptr<true>(&pStack_12138);
    (*p_Var1)(pvVar5);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"const hi_printable hi{}; printable_vtable ap; ap = hi",0x35);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,";\nap.print() = ",0xf);
  pStack_12138.get_value_ptr_ = printable_vtable::get_value_ptr<false>;
  pStack_12138.value_ = (void *)0x0;
  printable_vtable::operator=();
  p_Var1 = pStack_12138.vtable_._M_elems[2];
  pvVar5 = (*pStack_12138.get_value_ptr_)(&pStack_12138);
  (*p_Var1)(pvVar5);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"allocations: ",0xd);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n\n",2);
  p_Var1 = pStack_12138.vtable_._M_elems[1];
  allocations()::allocations_ = 0;
  if (pStack_12138.get_value_ptr_ == printable_vtable::get_value_ptr<true>) {
    pvVar5 = printable_vtable::get_value_ptr<true>(&pStack_12138);
    (*p_Var1)(pvVar5);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"const large_printable large{}; printable_vtable ap; ap = large",
             0x3e);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,";\nap.print() = ",0xf);
  allocations()::allocations_ = allocations()::allocations_ + 1;
  pStack_12138.vtable_._M_elems[0] = (_func_void *)calloc(1,0x800000);
  pStack_12138.vtable_._M_elems[1] = pStack_12138.vtable_._M_elems[0] + 0x800000;
  pStack_121f8.get_value_ptr_ = printable_vtable::get_value_ptr<false>;
  pStack_121f8.value_ = (void *)0x0;
  pStack_12138.vtable_._M_elems[2] = pStack_12138.vtable_._M_elems[1];
  std::vector<double,_std::allocator<double>_>::vector
            (&local_4060.data_,(vector<double,_std::allocator<double>_> *)&pStack_12138);
  printable_vtable::operator=(&pStack_121f8,&local_4060);
  if (local_4060.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    free(local_4060.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_start);
  }
  p_Var1 = pStack_121f8.vtable_._M_elems[2];
  pvVar5 = (*pStack_121f8.get_value_ptr_)(&pStack_121f8);
  (*p_Var1)(pvVar5);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"allocations: ",0xd);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n\n",2);
  p_Var1 = pStack_121f8.vtable_._M_elems[1];
  allocations()::allocations_ = 0;
  if (pStack_121f8.get_value_ptr_ == printable_vtable::get_value_ptr<true>) {
    pvVar5 = printable_vtable::get_value_ptr<true>(&pStack_121f8);
    (*p_Var1)(pvVar5);
  }
  if (pStack_12138.vtable_._M_elems[0] != (_func_void *)0x0) {
    free(pStack_12138.vtable_._M_elems[0]);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"const bye_printable bye{}; printable_vtable ap; ap = bye",0x38);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,";\nap.print() = ",0xf);
  pStack_12138.get_value_ptr_ = printable_vtable::get_value_ptr<false>;
  pStack_12138.value_ = (void *)0x0;
  printable_vtable::operator=();
  p_Var1 = pStack_12138.vtable_._M_elems[2];
  pvVar5 = (*pStack_12138.get_value_ptr_)(&pStack_12138);
  (*p_Var1)(pvVar5);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"allocations: ",0xd);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n\n",2);
  p_Var1 = pStack_12138.vtable_._M_elems[1];
  allocations()::allocations_ = 0;
  if (pStack_12138.get_value_ptr_ == printable_vtable::get_value_ptr<true>) {
    pvVar5 = printable_vtable::get_value_ptr<true>(&pStack_12138);
    (*p_Var1)(pvVar5);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"printable_vtable ap(hi_printable{})",0x23);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,";\nap.print() = ",0xf);
  pStack_12138.vtable_._M_elems[2] = printable_vtable::print_wrapper<hi_printable>::exec;
  pStack_12138.vtable_._M_elems[0] = printable_vtable::clone_impl<hi_printable>;
  pStack_12138.vtable_._M_elems[1] = printable_vtable::delete_impl<hi_printable>;
  pStack_12138.get_value_ptr_ = printable_vtable::get_value_ptr<false>;
  pStack_12138.value_ = (void *)0x0;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Hello, world!\n",0xe);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"allocations: ",0xd);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n\n",2);
  p_Var1 = pStack_12138.vtable_._M_elems[1];
  allocations()::allocations_ = 0;
  if (pStack_12138.get_value_ptr_ == printable_vtable::get_value_ptr<true>) {
    pvVar5 = printable_vtable::get_value_ptr<true>(&pStack_12138);
    (*p_Var1)(pvVar5);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"printable_vtable ap(large_printable{})",0x26);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,";\nap.print() = ",0xf);
  lVar10 = allocations()::allocations_;
  pvVar5 = calloc(1,0x800000);
  pStack_12138.vtable_._M_elems[0] = printable_vtable::clone_impl<large_printable>;
  pStack_12138.vtable_._M_elems[1] = printable_vtable::delete_impl<large_printable>;
  pStack_12138.vtable_._M_elems[2] = printable_vtable::print_wrapper<large_printable>::exec;
  pStack_12138.get_value_ptr_ = printable_vtable::get_value_ptr<true>;
  allocations()::allocations_ = lVar10 + 2;
  pStack_12138.value_ = malloc(0x2018);
  *(void **)pStack_12138.value_ = pvVar5;
  *(long *)((long)pStack_12138.value_ + 8) = (long)pvVar5 + 0x800000;
  *(long *)((long)pStack_12138.value_ + 0x10) = (long)pvVar5 + 0x800000;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"I\'m expensive to copy.\n",0x17);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"allocations: ",0xd);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n\n",2);
  p_Var1 = pStack_12138.vtable_._M_elems[1];
  allocations()::allocations_ = 0;
  if (pStack_12138.get_value_ptr_ == printable_vtable::get_value_ptr<true>) {
    pvVar5 = printable_vtable::get_value_ptr<true>(&pStack_12138);
    (*p_Var1)(pvVar5);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"printable_vtable ap(bye_printable{})",0x24);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,";\nap.print() = ",0xf);
  pStack_12138.vtable_._M_elems[2] = printable_vtable::print_wrapper<bye_printable>::exec;
  pStack_12138.vtable_._M_elems[0] = printable_vtable::clone_impl<bye_printable>;
  pStack_12138.vtable_._M_elems[1] = printable_vtable::delete_impl<bye_printable>;
  pStack_12138.get_value_ptr_ = printable_vtable::get_value_ptr<false>;
  pStack_12138.value_ = (void *)0x0;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Bye, now!\n",10);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"allocations: ",0xd);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n\n",2);
  p_Var1 = pStack_12138.vtable_._M_elems[1];
  allocations()::allocations_ = 0;
  if (pStack_12138.get_value_ptr_ == printable_vtable::get_value_ptr<true>) {
    pvVar5 = printable_vtable::get_value_ptr<true>(&pStack_12138);
    (*p_Var1)(pvVar5);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"printable_vtable ap = hi_printable{}",0x24);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,";\nap.print() = ",0xf);
  pStack_12138.vtable_._M_elems[2] = printable_vtable::print_wrapper<hi_printable>::exec;
  pStack_12138.vtable_._M_elems[0] = printable_vtable::clone_impl<hi_printable>;
  pStack_12138.vtable_._M_elems[1] = printable_vtable::delete_impl<hi_printable>;
  pStack_12138.get_value_ptr_ = printable_vtable::get_value_ptr<false>;
  pStack_12138.value_ = (void *)0x0;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Hello, world!\n",0xe);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"allocations: ",0xd);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n\n",2);
  p_Var1 = pStack_12138.vtable_._M_elems[1];
  allocations()::allocations_ = 0;
  if (pStack_12138.get_value_ptr_ == printable_vtable::get_value_ptr<true>) {
    pvVar5 = printable_vtable::get_value_ptr<true>(&pStack_12138);
    (*p_Var1)(pvVar5);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"printable_vtable ap = large_printable{}",0x27);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,";\nap.print() = ",0xf);
  lVar10 = allocations()::allocations_;
  pvVar5 = calloc(1,0x800000);
  pStack_12138.vtable_._M_elems[0] = printable_vtable::clone_impl<large_printable>;
  pStack_12138.vtable_._M_elems[1] = printable_vtable::delete_impl<large_printable>;
  pStack_12138.vtable_._M_elems[2] = printable_vtable::print_wrapper<large_printable>::exec;
  pStack_12138.get_value_ptr_ = printable_vtable::get_value_ptr<true>;
  allocations()::allocations_ = lVar10 + 2;
  pStack_12138.value_ = malloc(0x2018);
  *(void **)pStack_12138.value_ = pvVar5;
  *(long *)((long)pStack_12138.value_ + 8) = (long)pvVar5 + 0x800000;
  *(long *)((long)pStack_12138.value_ + 0x10) = (long)pvVar5 + 0x800000;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"I\'m expensive to copy.\n",0x17);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"allocations: ",0xd);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n\n",2);
  p_Var1 = pStack_12138.vtable_._M_elems[1];
  allocations()::allocations_ = 0;
  if (pStack_12138.get_value_ptr_ == printable_vtable::get_value_ptr<true>) {
    pvVar5 = printable_vtable::get_value_ptr<true>(&pStack_12138);
    (*p_Var1)(pvVar5);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"printable_vtable ap = bye_printable{}",0x25);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,";\nap.print() = ",0xf);
  pStack_12138.vtable_._M_elems[2] = printable_vtable::print_wrapper<bye_printable>::exec;
  pStack_12138.vtable_._M_elems[0] = printable_vtable::clone_impl<bye_printable>;
  pStack_12138.vtable_._M_elems[1] = printable_vtable::delete_impl<bye_printable>;
  pStack_12138.get_value_ptr_ = printable_vtable::get_value_ptr<false>;
  pStack_12138.value_ = (void *)0x0;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Bye, now!\n",10);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"allocations: ",0xd);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n\n",2);
  p_Var1 = pStack_12138.vtable_._M_elems[1];
  allocations()::allocations_ = 0;
  if (pStack_12138.get_value_ptr_ == printable_vtable::get_value_ptr<true>) {
    pvVar5 = printable_vtable::get_value_ptr<true>(&pStack_12138);
    (*p_Var1)(pvVar5);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"hi_printable hi; printable_vtable ap(std::ref(hi))",0x32);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,";\nap.print() = ",0xf);
  pStack_12138.vtable_._M_elems[2] =
       printable_vtable::print_wrapper<std::reference_wrapper<hi_printable>_>::exec;
  pStack_12138.vtable_._M_elems[0] =
       printable_vtable::clone_impl<std::reference_wrapper<hi_printable>>;
  pStack_12138.vtable_._M_elems[1] =
       printable_vtable::delete_impl<std::reference_wrapper<hi_printable>>;
  pStack_12138.get_value_ptr_ = printable_vtable::get_value_ptr<false>;
  pStack_12138.value_ = &pStack_121f8;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Hello, world!\n",0xe);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"allocations: ",0xd);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n\n",2);
  p_Var1 = pStack_12138.vtable_._M_elems[1];
  allocations()::allocations_ = 0;
  if (pStack_12138.get_value_ptr_ == printable_vtable::get_value_ptr<true>) {
    pvVar5 = printable_vtable::get_value_ptr<true>(&pStack_12138);
    (*p_Var1)(pvVar5);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"large_printable large; printable_vtable ap(std::ref(large))",
             0x3b);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,";\nap.print() = ",0xf);
  allocations()::allocations_ = allocations()::allocations_ + 1;
  pStack_12138.vtable_._M_elems[0] = (_func_void *)calloc(1,0x800000);
  pStack_12138.vtable_._M_elems[1] = pStack_12138.vtable_._M_elems[0] + 0x800000;
  pStack_121f8.vtable_._M_elems[2] =
       printable_vtable::print_wrapper<std::reference_wrapper<large_printable>_>::exec;
  pStack_121f8.vtable_._M_elems[0] =
       printable_vtable::clone_impl<std::reference_wrapper<large_printable>>;
  pStack_121f8.vtable_._M_elems[1] =
       printable_vtable::delete_impl<std::reference_wrapper<large_printable>>;
  pStack_121f8.get_value_ptr_ = printable_vtable::get_value_ptr<false>;
  pStack_121f8.value_ = &pStack_12138;
  pStack_12138.vtable_._M_elems[2] = pStack_12138.vtable_._M_elems[1];
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"I\'m expensive to copy.\n",0x17);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"allocations: ",0xd);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n\n",2);
  p_Var1 = pStack_121f8.vtable_._M_elems[1];
  allocations()::allocations_ = 0;
  if (pStack_121f8.get_value_ptr_ == printable_vtable::get_value_ptr<true>) {
    pvVar5 = printable_vtable::get_value_ptr<true>(&pStack_121f8);
    (*p_Var1)(pvVar5);
  }
  if (pStack_12138.vtable_._M_elems[0] != (_func_void *)0x0) {
    free(pStack_12138.vtable_._M_elems[0]);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"bye_printable bye; printable_vtable ap(std::ref(bye))",0x35);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,";\nap.print() = ",0xf);
  pStack_12138.vtable_._M_elems[2] =
       printable_vtable::print_wrapper<std::reference_wrapper<bye_printable>_>::exec;
  pStack_12138.vtable_._M_elems[0] =
       printable_vtable::clone_impl<std::reference_wrapper<bye_printable>>;
  pStack_12138.vtable_._M_elems[1] =
       printable_vtable::delete_impl<std::reference_wrapper<bye_printable>>;
  pStack_12138.get_value_ptr_ = printable_vtable::get_value_ptr<false>;
  pStack_12138.value_ = &pStack_121f8;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Bye, now!\n",10);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"allocations: ",0xd);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n\n",2);
  p_Var1 = pStack_12138.vtable_._M_elems[1];
  allocations()::allocations_ = 0;
  if (pStack_12138.get_value_ptr_ == printable_vtable::get_value_ptr<true>) {
    pvVar5 = printable_vtable::get_value_ptr<true>(&pStack_12138);
    (*p_Var1)(pvVar5);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"hi_printable hi; printable_vtable ap(std::cref(hi))",0x33);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,";\nap.print() = ",0xf);
  pStack_12138.vtable_._M_elems[2] =
       printable_vtable::print_wrapper<std::reference_wrapper<const_hi_printable>_>::exec;
  pStack_12138.vtable_._M_elems[0] =
       printable_vtable::clone_impl<std::reference_wrapper<hi_printable_const>>;
  pStack_12138.vtable_._M_elems[1] =
       printable_vtable::delete_impl<std::reference_wrapper<hi_printable_const>>;
  pStack_12138.get_value_ptr_ = printable_vtable::get_value_ptr<false>;
  pStack_12138.value_ = &pStack_121f8;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Hello, world!\n",0xe);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"allocations: ",0xd);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n\n",2);
  p_Var1 = pStack_12138.vtable_._M_elems[1];
  allocations()::allocations_ = 0;
  if (pStack_12138.get_value_ptr_ == printable_vtable::get_value_ptr<true>) {
    pvVar5 = printable_vtable::get_value_ptr<true>(&pStack_12138);
    (*p_Var1)(pvVar5);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"large_printable large; printable_vtable ap(std::cref(large))",
             0x3c);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,";\nap.print() = ",0xf);
  allocations()::allocations_ = allocations()::allocations_ + 1;
  pStack_12138.vtable_._M_elems[0] = (_func_void *)calloc(1,0x800000);
  pStack_12138.vtable_._M_elems[1] = pStack_12138.vtable_._M_elems[0] + 0x800000;
  pStack_121f8.vtable_._M_elems[2] =
       printable_vtable::print_wrapper<std::reference_wrapper<const_large_printable>_>::exec;
  pStack_121f8.vtable_._M_elems[0] =
       printable_vtable::clone_impl<std::reference_wrapper<large_printable_const>>;
  pStack_121f8.vtable_._M_elems[1] =
       printable_vtable::delete_impl<std::reference_wrapper<large_printable_const>>;
  pStack_121f8.get_value_ptr_ = printable_vtable::get_value_ptr<false>;
  pStack_121f8.value_ = &pStack_12138;
  pStack_12138.vtable_._M_elems[2] = pStack_12138.vtable_._M_elems[1];
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"I\'m expensive to copy.\n",0x17);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"allocations: ",0xd);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n\n",2);
  p_Var1 = pStack_121f8.vtable_._M_elems[1];
  allocations()::allocations_ = 0;
  if (pStack_121f8.get_value_ptr_ == printable_vtable::get_value_ptr<true>) {
    pvVar5 = printable_vtable::get_value_ptr<true>(&pStack_121f8);
    (*p_Var1)(pvVar5);
  }
  if (pStack_12138.vtable_._M_elems[0] != (_func_void *)0x0) {
    free(pStack_12138.vtable_._M_elems[0]);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"bye_printable bye; printable_vtable ap(std::cref(bye))",0x36);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,";\nap.print() = ",0xf);
  pStack_12138.vtable_._M_elems[2] =
       printable_vtable::print_wrapper<std::reference_wrapper<const_bye_printable>_>::exec;
  pStack_12138.vtable_._M_elems[0] =
       printable_vtable::clone_impl<std::reference_wrapper<bye_printable_const>>;
  pStack_12138.vtable_._M_elems[1] =
       printable_vtable::delete_impl<std::reference_wrapper<bye_printable_const>>;
  pStack_12138.get_value_ptr_ = printable_vtable::get_value_ptr<false>;
  pStack_12138.value_ = &pStack_121f8;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Bye, now!\n",10);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"allocations: ",0xd);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n\n",2);
  p_Var1 = pStack_12138.vtable_._M_elems[1];
  allocations()::allocations_ = 0;
  if (pStack_12138.get_value_ptr_ == printable_vtable::get_value_ptr<true>) {
    pvVar5 = printable_vtable::get_value_ptr<true>(&pStack_12138);
    (*p_Var1)(pvVar5);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"copied vector<printable_vtable>{hi_printable, large_printable}",
             0x3e);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
  lVar10 = allocations()::allocations_;
  pStack_12138.vtable_._M_elems[2] = printable_vtable::print_wrapper<hi_printable>::exec;
  pStack_12138.vtable_._M_elems[0] = printable_vtable::clone_impl<hi_printable>;
  pStack_12138.vtable_._M_elems[1] = printable_vtable::delete_impl<hi_printable>;
  pStack_12138.get_value_ptr_ = printable_vtable::get_value_ptr<false>;
  pStack_12138.value_ = (void *)0x0;
  pvVar5 = calloc(1,0x800000);
  apStack_12110[0].vtable_._M_elems[0] = printable_vtable::clone_impl<large_printable>;
  apStack_12110[0].vtable_._M_elems[1] = printable_vtable::delete_impl<large_printable>;
  apStack_12110[0].vtable_._M_elems[2] = printable_vtable::print_wrapper<large_printable>::exec;
  apStack_12110[0].get_value_ptr_ = printable_vtable::get_value_ptr<true>;
  allocations()::allocations_ = lVar10 + 2;
  apStack_12110[0].value_ = malloc(0x2018);
  *(void **)apStack_12110[0].value_ = pvVar5;
  *(long *)((long)apStack_12110[0].value_ + 8) = (long)pvVar5 + 0x800000;
  *(long *)((long)apStack_12110[0].value_ + 0x10) = (long)pvVar5 + 0x800000;
  __l._M_len = 2;
  __l._M_array = &pStack_12138;
  std::vector<printable_vtable,_std::allocator<printable_vtable>_>::vector
            ((vector<printable_vtable,_std::allocator<printable_vtable>_> *)&pStack_121f8,__l,
             (allocator_type *)&pStack_121c8);
  lVar10 = -0x50;
  ppVar8 = apStack_12110;
  do {
    if (ppVar8->get_value_ptr_ == printable_vtable::get_value_ptr<true>) {
      p_Var1 = (ppVar8->vtable_)._M_elems[1];
      pvVar5 = printable_vtable::get_value_ptr<true>(ppVar8);
      (*p_Var1)(pvVar5);
    }
    p_Var1 = pStack_121f8.vtable_._M_elems[1];
    ppVar8 = ppVar8 + -1;
    lVar10 = lVar10 + 0x28;
    ppVar9 = (printable_vtable *)pStack_121f8.vtable_._M_elems[0];
  } while (lVar10 != 0);
  for (; ppVar9 != (printable_vtable *)p_Var1; ppVar9 = ppVar9 + 1) {
    p_Var2 = (ppVar9->vtable_)._M_elems[2];
    pvVar5 = (*ppVar9->get_value_ptr_)(ppVar9);
    (*p_Var2)(pvVar5);
  }
  std::vector<printable_vtable,_std::allocator<printable_vtable>_>::vector
            ((vector<printable_vtable,_std::allocator<printable_vtable>_> *)&pStack_12138,
             (vector<printable_vtable,_std::allocator<printable_vtable>_> *)&pStack_121f8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"allocations: ",0xd);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n\n",2);
  allocations()::allocations_ = 0;
  std::vector<printable_vtable,_std::allocator<printable_vtable>_>::~vector
            ((vector<printable_vtable,_std::allocator<printable_vtable>_> *)&pStack_12138);
  std::vector<printable_vtable,_std::allocator<printable_vtable>_>::~vector
            ((vector<printable_vtable,_std::allocator<printable_vtable>_> *)&pStack_121f8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "copied vector<COW<printable_vtable>>{hi_printable, large_printable}",0x43);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
  lVar10 = allocations()::allocations_;
  pStack_12168.vtable_._M_elems[0] = printable_vtable::clone_impl<hi_printable>;
  pStack_12168.vtable_._M_elems[1] = printable_vtable::delete_impl<hi_printable>;
  pStack_12168.vtable_._M_elems[2] = printable_vtable::print_wrapper<hi_printable>::exec;
  pStack_12168.value_ = (void *)0x0;
  pStack_12138.vtable_._M_elems[1] = (_func_void *)malloc(0x38);
  *(undefined8 *)(pStack_12138.vtable_._M_elems[1] + 8) = 0x100000001;
  *(undefined ***)pStack_12138.vtable_._M_elems[1] = &PTR___Sp_counted_ptr_inplace_00109d48;
  pStack_12138.vtable_._M_elems[0] = pStack_12138.vtable_._M_elems[1] + 0x10;
  *(code **)(pStack_12138.vtable_._M_elems[1] + 0x10) = printable_vtable::clone_impl<hi_printable>;
  *(code **)(pStack_12138.vtable_._M_elems[1] + 0x18) = printable_vtable::delete_impl<hi_printable>;
  *(code **)(pStack_12138.vtable_._M_elems[1] + 0x20) =
       printable_vtable::print_wrapper<hi_printable>::exec;
  *(code **)(pStack_12138.vtable_._M_elems[1] + 0x28) = printable_vtable::get_value_ptr<false>;
  *(undefined8 *)(pStack_12138.vtable_._M_elems[1] + 0x30) = 0;
  pStack_12168.get_value_ptr_ = printable_vtable::get_value_ptr<false>;
  pvVar5 = calloc(1,0x800000);
  pStack_12198.vtable_._M_elems[0] = printable_vtable::clone_impl<large_printable>;
  pStack_12198.vtable_._M_elems[1] = printable_vtable::delete_impl<large_printable>;
  pStack_12198.vtable_._M_elems[2] = printable_vtable::print_wrapper<large_printable>::exec;
  puVar7 = (undefined8 *)malloc(0x2018);
  *puVar7 = pvVar5;
  puVar7[1] = (long)pvVar5 + 0x800000;
  puVar7[2] = (long)pvVar5 + 0x800000;
  allocations()::allocations_ = lVar10 + 4;
  pStack_12198.value_ = puVar7;
  pStack_12138.get_value_ptr_ = (get_value_ptr_type)malloc(0x38);
  *(undefined8 *)(pStack_12138.get_value_ptr_ + 8) = 0x100000001;
  *(undefined ***)pStack_12138.get_value_ptr_ = &PTR___Sp_counted_ptr_inplace_00109d48;
  pStack_12138.vtable_._M_elems[2] = (_func_void *)(pStack_12138.get_value_ptr_ + 0x10);
  *(code **)(pStack_12138.get_value_ptr_ + 0x10) = printable_vtable::clone_impl<large_printable>;
  *(code **)(pStack_12138.get_value_ptr_ + 0x18) = printable_vtable::delete_impl<large_printable>;
  *(code **)(pStack_12138.get_value_ptr_ + 0x20) =
       printable_vtable::print_wrapper<large_printable>::exec;
  *(code **)(pStack_12138.get_value_ptr_ + 0x28) = printable_vtable::get_value_ptr<true>;
  *(undefined8 **)(pStack_12138.get_value_ptr_ + 0x30) = puVar7;
  pStack_12198.get_value_ptr_ = printable_vtable::get_value_ptr<false>;
  __l_00._M_len = 2;
  __l_00._M_array = (iterator)&pStack_12138;
  std::vector<copy_on_write<printable_vtable>,_std::allocator<copy_on_write<printable_vtable>_>_>::
  vector((vector<copy_on_write<printable_vtable>,_std::allocator<copy_on_write<printable_vtable>_>_>
          *)&pStack_121f8,__l_00,(allocator_type *)&pStack_121c8);
  lVar10 = 0x20;
  do {
    if (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)&p_Stack_12140 + lVar10) !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)&p_Stack_12140 + lVar10));
    }
    p_Var1 = pStack_12198.vtable_._M_elems[1];
    lVar10 = lVar10 + -0x10;
  } while (lVar10 != 0);
  if (pStack_12198.get_value_ptr_ == printable_vtable::get_value_ptr<true>) {
    pvVar5 = printable_vtable::get_value_ptr<true>(&pStack_12198);
    (*p_Var1)(pvVar5);
  }
  p_Var1 = pStack_12168.vtable_._M_elems[1];
  ppVar9 = (printable_vtable *)pStack_121f8.vtable_._M_elems[0];
  ppVar8 = (printable_vtable *)pStack_121f8.vtable_._M_elems[1];
  if (pStack_12168.get_value_ptr_ == printable_vtable::get_value_ptr<true>) {
    pvVar5 = printable_vtable::get_value_ptr<true>(&pStack_12168);
    (*p_Var1)(pvVar5);
    ppVar9 = (printable_vtable *)pStack_121f8.vtable_._M_elems[0];
    ppVar8 = (printable_vtable *)pStack_121f8.vtable_._M_elems[1];
  }
  while( true ) {
    if (ppVar9 == ppVar8) {
      std::
      vector<copy_on_write<printable_vtable>,_std::allocator<copy_on_write<printable_vtable>_>_>::
      vector((vector<copy_on_write<printable_vtable>,_std::allocator<copy_on_write<printable_vtable>_>_>
              *)&pStack_12138,
             (vector<copy_on_write<printable_vtable>,_std::allocator<copy_on_write<printable_vtable>_>_>
              *)&pStack_121f8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"allocations: ",0xd);
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n\n",2);
      allocations()::allocations_ = 0;
      std::
      vector<copy_on_write<printable_vtable>,_std::allocator<copy_on_write<printable_vtable>_>_>::
      ~vector((vector<copy_on_write<printable_vtable>,_std::allocator<copy_on_write<printable_vtable>_>_>
               *)&pStack_12138);
      std::
      vector<copy_on_write<printable_vtable>,_std::allocator<copy_on_write<printable_vtable>_>_>::
      ~vector((vector<copy_on_write<printable_vtable>,_std::allocator<copy_on_write<printable_vtable>_>_>
               *)&pStack_121f8);
      return 0;
    }
    p_Var1 = (ppVar9->vtable_)._M_elems[0];
    if (p_Var1 == (_func_void *)0x0) break;
    pcVar3 = *(code **)(p_Var1 + 0x10);
    uVar6 = (**(code **)(p_Var1 + 0x18))();
    (*pcVar3)(uVar6);
    ppVar9 = (printable_vtable *)((ppVar9->vtable_)._M_elems + 2);
  }
  __assert_fail("impl_ && \"Attempted to use a moved-from copy_on_write object.\"",
                "/workspace/llm4binary/github/license_c_cmakelists/tzlaine[P]type_erasure/copy_on_write.hpp"
                ,0x22,
                "const value_type &copy_on_write<printable_vtable>::read() const [T = printable_vtable]"
               );
}

Assistant:

int main ()
{
#if INSTRUMENT_COPIES
    reset_allocations();
#endif

    std::cout << "sizeof(printable_vtable) = " << sizeof(printable_vtable) << "\n";

#define ECHO(expr)                                                      \
    do {                                                                \
        std::cout << #expr << ";\nap.print() = ";                       \
        expr;                                                           \
        ap.print();                                                     \
        std::cout << "allocations: " << allocations() << "\n\n";        \
        reset_allocations();                                            \
    } while (false)

    ECHO(hi_printable hi; printable_vtable ap(hi));
    ECHO(large_printable large; printable_vtable ap(large));
    ECHO(bye_printable bye; printable_vtable ap(bye));

    ECHO(hi_printable hi; printable_vtable ap = hi);
    ECHO(large_printable large; printable_vtable ap = large);
    ECHO(bye_printable bye; printable_vtable ap = bye);

    ECHO(hi_printable hi; printable_vtable tmp = hi; printable_vtable ap = tmp);
    ECHO(large_printable large; printable_vtable tmp = large; printable_vtable ap = tmp);
    ECHO(bye_printable bye; printable_vtable tmp = bye; printable_vtable ap = tmp);

    ECHO(hi_printable hi; printable_vtable ap; ap = hi);
    ECHO(large_printable large; printable_vtable ap; ap = large);
    ECHO(bye_printable bye; printable_vtable ap; ap = bye);

    ECHO(const hi_printable hi{}; printable_vtable ap(hi));
    ECHO(const large_printable large{}; printable_vtable ap(large));
    ECHO(const bye_printable bye{}; printable_vtable ap(bye));

    ECHO(const hi_printable hi{}; printable_vtable ap = hi);
    ECHO(const large_printable large{}; printable_vtable ap = large);
    ECHO(const bye_printable bye{}; printable_vtable ap = bye);

    ECHO(const hi_printable hi{}; printable_vtable tmp = hi; printable_vtable ap = tmp);
    ECHO(const large_printable large{}; printable_vtable tmp = large; printable_vtable ap = tmp);
    ECHO(const bye_printable bye{}; printable_vtable tmp = bye; printable_vtable ap = tmp);

    ECHO(const hi_printable hi{}; printable_vtable ap; ap = hi);
    ECHO(const large_printable large{}; printable_vtable ap; ap = large);
    ECHO(const bye_printable bye{}; printable_vtable ap; ap = bye);

    ECHO(printable_vtable ap(hi_printable{}));
    ECHO(printable_vtable ap(large_printable{}));
    ECHO(printable_vtable ap(bye_printable{}));

    ECHO(printable_vtable ap = hi_printable{});
    ECHO(printable_vtable ap = large_printable{});
    ECHO(printable_vtable ap = bye_printable{});

    ECHO(hi_printable hi; printable_vtable ap(std::ref(hi)));
    ECHO(large_printable large; printable_vtable ap(std::ref(large)));
    ECHO(bye_printable bye; printable_vtable ap(std::ref(bye)));

    ECHO(hi_printable hi; printable_vtable ap(std::cref(hi)));
    ECHO(large_printable large; printable_vtable ap(std::cref(large)));
    ECHO(bye_printable bye; printable_vtable ap(std::cref(bye)));

#undef ECHO

    {
        std::cout << "copied vector<printable_vtable>{hi_printable, large_printable}" << "\n";

        std::vector<printable_vtable> several_printables = {
            hi_printable{},
            large_printable{}
        };

        for (const auto & printable : several_printables) {
            printable.print();
        }

        std::vector<printable_vtable> several_printables_copy = several_printables;

        std::cout << "allocations: " << allocations() << "\n\n";
        reset_allocations();
    }

    {
        std::cout << "copied vector<COW<printable_vtable>>{hi_printable, large_printable}" << "\n";

        std::vector<copy_on_write<printable_vtable>> several_printables = {
            {hi_printable{}},
            {large_printable{}}
        };

        for (const auto & printable : several_printables) {
            printable->print();
        }

        std::vector<copy_on_write<printable_vtable>> several_printables_copy = several_printables;

        std::cout << "allocations: " << allocations() << "\n\n";
        reset_allocations();
    }

    return 0;
}